

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int Curl_dyn_vprintf(dynbuf *dyn,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  dynbuf *local_38;
  asprintf info;
  __va_list_tag *ap_save_local;
  char *format_local;
  dynbuf *dyn_local;
  
  info.b._0_1_ = 0;
  local_38 = dyn;
  info._8_8_ = ap_save;
  dprintf_formatf(&local_38,alloc_addbyter,format,ap_save);
  bVar1 = ((byte)info.b & 1) != 0;
  if (bVar1) {
    Curl_dyn_free(local_38);
  }
  dyn_local._4_4_ = (uint)bVar1;
  return dyn_local._4_4_;
}

Assistant:

int Curl_dyn_vprintf(struct dynbuf *dyn, const char *format, va_list ap_save)
{
  struct asprintf info;
  info.b = dyn;
  info.fail = 0;

  (void)dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if(info.fail) {
    Curl_dyn_free(info.b);
    return 1;
  }
  return 0;
}